

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O2

Region * __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::detect(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
         *this,uint8_t *pixels,uint width,uint height,
        RegionAllocator<RegionDetector::Region> *regionAllocator)

{
  pointer ppVar1;
  pointer ppVar2;
  uint i;
  uint uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  long lVar6;
  uint pixel;
  ulong uVar7;
  char *pcVar8;
  uint edge;
  uint uVar9;
  undefined1 local_18f8 [8];
  vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
  boundaryPixels [256];
  Region rootRegion;
  undefined1 auStack_78 [8];
  vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> componentStack;
  ulong local_50;
  pair<unsigned_int,_unsigned_char> local_40;
  uint local_34;
  
  if (height == 0 || width == 0) {
    rootRegion.next = (Region *)0x0;
  }
  else {
    uVar7 = (ulong)(height * width);
    puVar4 = (undefined1 *)operator_new__(uVar7);
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      puVar4[uVar5] = 0;
    }
    _auStack_78 = (undefined1  [16])0x0;
    componentStack.
    super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::reserve
              ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
               auStack_78,0x100);
    local_50 = 0;
    memset(local_18f8,0,0x1800);
    uVar9 = (uint)*pixels;
    *puVar4 = 1;
    local_40 = (pair<unsigned_int,_unsigned_char>)
               &boundaryPixels[0xff].
                super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    boundaryPixels[0xff].
    super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>>::
    emplace_back<RegionDetector::Region*>
              ((vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>> *)auStack_78
               ,(Region **)&local_40);
LAB_0015e998:
    local_34 = uVar9;
    local_40 = (pair<unsigned_int,_unsigned_char>)
               RegionAllocator<RegionDetector::Region>::new_(regionAllocator,uVar9);
    std::vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>>::
    emplace_back<RegionDetector::Region*>
              ((vector<RegionDetector::Region*,std::allocator<RegionDetector::Region*>> *)auStack_78
               ,(Region **)&local_40);
    if (componentStack.
        super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
        _M_impl.super__Vector_impl_data._M_start[-1] == (Region *)0x0) {
      pcVar8 = "componentStack.back() != nullptr";
      uVar9 = 0x6d;
LAB_0015ebde:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                    ,uVar9,
                    "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    edge = 0;
    do {
      for (edge = edge & 0xff; pixel = (uint)local_50, edge < 4; edge = edge + 1) {
        uVar3 = getNeighborIdx(this,pixel,width,height,edge);
        if (height * width <= uVar3) {
          pcVar8 = "neighborIdx < width*height";
          uVar9 = 0x71;
          goto LAB_0015ebde;
        }
        if (puVar4[uVar3] == '\0') {
          puVar4[uVar3] = 1;
          uVar9 = (uint)pixels[uVar3];
          if (pixels[uVar3] < local_34) {
            local_40.second = (char)edge + '\x01';
            local_40.first = pixel;
            std::
            vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
            ::emplace_back<std::pair<unsigned_int,unsigned_char>>
                      ((vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
                        *)&boundaryPixels[(ulong)local_34 - 1].
                           super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_40);
            local_50 = (ulong)uVar3;
            goto LAB_0015e998;
          }
          local_40.second = '\0';
          local_40.first = uVar3;
          std::
          vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
          ::emplace_back<std::pair<unsigned_int,unsigned_char>>
                    ((vector<std::pair<unsigned_int,unsigned_char>,std::allocator<std::pair<unsigned_int,unsigned_char>>>
                      *)&boundaryPixels[(ulong)uVar9 - 1].
                         super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_40);
        }
      }
      if (auStack_78 ==
          (undefined1  [8])
          componentStack.
          super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        __assert_fail("!componentStack.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                      ,0x84,
                      "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                     );
      }
      Region::accumulate(componentStack.
                         super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1],pixel,(uint)pixels[local_50],
                         width);
      uVar9 = local_34;
      do {
        ppVar1 = boundaryPixels[(ulong)uVar9 - 1].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar2 = boundaryPixels[uVar9].
                 super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (ppVar1 != ppVar2) {
          local_50 = (ulong)ppVar2[-1].first;
          edge = (uint)ppVar2[-1].second;
          boundaryPixels[uVar9].
          super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar2 + -1;
          uVar9 = (uint)pixels[local_50];
          if (local_34 != uVar9) {
            if (uVar9 <= local_34) {
              __assert_fail("currentLevel > previousLevel",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                            ,0x9f,
                            "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                           );
            }
            processStack(this,uVar9,
                         (vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                          *)auStack_78,regionAllocator);
            local_34 = uVar9;
          }
          goto LAB_0015eb2b;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < 0x100);
      if ((long)componentStack.
                super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 != 0x10) {
        __assert_fail("componentStack.size() == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                      ,0x8d,
                      "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                     );
      }
      uVar5 = 0;
      while (uVar7 != uVar5) {
        pcVar8 = puVar4 + uVar5;
        uVar5 = uVar5 + 1;
        if (*pcVar8 == '\0') {
          __assert_fail("accessible[i] == true",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/./RegionDetector/RegionDetector.hpp"
                        ,0xaa,
                        "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                       );
        }
      }
      operator_delete__(puVar4);
      rootRegion.next =
           componentStack.
           super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
           _M_impl.super__Vector_impl_data._M_start[-1];
      local_34 = uVar9;
LAB_0015eb2b:
    } while (ppVar1 != ppVar2);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               &boundaryPixels[0xff].
                super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lVar6 = 0x17e8;
    do {
      std::
      _Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
      ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                       *)(local_18f8 + lVar6));
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != -0x18);
    std::_Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::
    ~_Vector_base((_Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                   *)auStack_78);
  }
  return rootRegion.next;
}

Assistant:

REGION_TYPE* detect(uint8_t const * const pixels, const unsigned int width, const unsigned int height, REGION_ALLOCATOR_TYPE *regionAllocator) {

			// pixel index first, edge second
			typedef std::pair<unsigned int, unsigned char> PixelAndEdgeType;

			if (width == 0 || height == 0) {
				return nullptr;
			}

			const int N_NEIGHBORS = 4;

			// true if the pixel has already been accessed
			bool * const accessible = new bool[width*height];
			assert(accessible);
			for (unsigned int i = 0; i < width*height; i++) {
				accessible[i] = false;
			}

			std::vector<REGION_TYPE*> componentStack;
			componentStack.reserve(256);

			std::vector<PixelAndEdgeType> boundaryPixels[256];

			unsigned int currentIdx = 0;
			unsigned int currentLevel = pixels[currentIdx];

			accessible[currentIdx] = true;
			REGION_TYPE rootRegion(256);
			componentStack.push_back(&rootRegion);

			unsigned char currentEdge = 0;

		push_empty_component:
			componentStack.push_back(regionAllocator->new_(currentLevel));
			assert(componentStack.back() != nullptr);
		check_neighbors:
			for (; currentEdge < N_NEIGHBORS; currentEdge++) {
				const unsigned int neighborIdx = getNeighborIdx(currentIdx, width, height, currentEdge);
				assert(neighborIdx < width*height);
				if (!accessible[neighborIdx]) {
					accessible[neighborIdx] = true;
					unsigned int neighborLevel = pixels[neighborIdx];
					if (neighborLevel < currentLevel) {
						// neighbor is smaller, push this pixel back
						boundaryPixels[currentLevel].push_back(PixelAndEdgeType(currentIdx, currentEdge + 1));
						currentIdx = neighborIdx;
						currentLevel = neighborLevel;
						currentEdge = 0;
						goto push_empty_component;
					}
					else
					{
						boundaryPixels[neighborLevel].push_back(PixelAndEdgeType(neighborIdx, 0));
					}
				}
			}

			assert(!componentStack.empty());
			auto comp = componentStack.back();
			comp->accumulate(currentIdx, pixels[currentIdx], width);
			const unsigned int previousLevel = currentLevel;

			while (boundaryPixels[currentLevel].empty()) {
				currentLevel++;

				if (currentLevel > 255) {
					assert(componentStack.size() == 2);
					goto done;
				}
			}

			{
				PixelAndEdgeType pe = boundaryPixels[currentLevel].back();
				currentIdx = pe.first;
				currentEdge = pe.second;
			}
			boundaryPixels[currentLevel].pop_back();

			currentLevel = pixels[currentIdx];

			{
				unsigned int newPixelGrayLevel = pixels[currentIdx];

				if (currentLevel != previousLevel) {
					assert(currentLevel > previousLevel);
					currentLevel = newPixelGrayLevel;
					processStack(newPixelGrayLevel, componentStack, regionAllocator);
				}
			}
			goto check_neighbors;


		done:
			// all pixels must be accessible in the end
			for (unsigned int i = 0; i < width*height; i++) {
				assert(accessible[i] == true);
			}

			delete[] accessible;
			return componentStack.back();
		}